

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConvexDecomposition.cpp
# Opt level: O1

void __thiscall chrono::collision::ChConvexDecompositionHACD::Reset(ChConvexDecompositionHACD *this)

{
  pointer pVVar1;
  pointer pVVar2;
  HACD *pHVar3;
  
  pHVar3 = this->myHACD;
  if (pHVar3 != (HACD *)0x0) {
    HACD::HACD::~HACD(pHVar3);
    operator_delete(pHVar3,0x180);
  }
  this->myHACD = (HACD *)0x0;
  pHVar3 = (HACD *)::operator_new(0x180);
  HACD::HACD::HACD(pHVar3,(HeapManager *)0x0);
  this->myHACD = pHVar3;
  pVVar1 = (this->points).
           super__Vector_base<HACD::Vec3<double>,_std::allocator<HACD::Vec3<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->points).super__Vector_base<HACD::Vec3<double>,_std::allocator<HACD::Vec3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar1) {
    (this->points).super__Vector_base<HACD::Vec3<double>,_std::allocator<HACD::Vec3<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar1;
  }
  pVVar2 = (this->triangles).
           super__Vector_base<HACD::Vec3<long>,_std::allocator<HACD::Vec3<long>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->triangles).super__Vector_base<HACD::Vec3<long>,_std::allocator<HACD::Vec3<long>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar2) {
    (this->triangles).super__Vector_base<HACD::Vec3<long>,_std::allocator<HACD::Vec3<long>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar2;
  }
  return;
}

Assistant:

void ChConvexDecompositionHACD::Reset(void) {
    if (myHACD)
        HACD::DestroyHACD(myHACD);
    myHACD = 0;
    myHACD = HACD::CreateHACD();
    this->points.clear();
    this->triangles.clear();
}